

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

void __thiscall duckdb_snappy::SnappySinkAllocator::Flush(SnappySinkAllocator *this,size_t size)

{
  bool bVar1;
  unsigned_long *puVar2;
  long in_RSI;
  __normal_iterator<duckdb_snappy::SnappySinkAllocator::Datablock_*,_std::vector<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>_>
  *in_RDI;
  size_t block_size;
  Datablock *block;
  iterator __end2;
  iterator __begin2;
  vector<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
  *__range2;
  size_t size_written;
  vector<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
  *in_stack_ffffffffffffffa8;
  unsigned_long local_48;
  unsigned_long local_40;
  reference local_38;
  Datablock *local_30;
  __normal_iterator<duckdb_snappy::SnappySinkAllocator::Datablock_*,_std::vector<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>_>
  local_28;
  __normal_iterator<duckdb_snappy::SnappySinkAllocator::Datablock_*,_std::vector<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>_>
  *local_20;
  long local_18;
  long local_10;
  
  local_18 = 0;
  local_20 = in_RDI + 1;
  local_10 = in_RSI;
  local_28._M_current =
       (Datablock *)
       std::
       vector<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
       ::begin(in_stack_ffffffffffffffa8);
  local_30 = (Datablock *)
             std::
             vector<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
             ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<duckdb_snappy::SnappySinkAllocator::Datablock_*,_std::vector<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>_>
                               *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<duckdb_snappy::SnappySinkAllocator::Datablock_*,_std::vector<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>_>
               ::operator*(&local_28);
    local_48 = local_10 - local_18;
    puVar2 = std::min<unsigned_long>(&local_38->size,&local_48);
    local_40 = *puVar2;
    (**(code **)(in_RDI->_M_current->data + 0x20))
              (in_RDI->_M_current,local_38->data,local_40,Deleter,0);
    local_18 = local_40 + local_18;
    __gnu_cxx::
    __normal_iterator<duckdb_snappy::SnappySinkAllocator::Datablock_*,_std::vector<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>_>
    ::operator++(&local_28);
  }
  std::
  vector<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
  ::clear((vector<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
           *)0x74823a);
  return;
}

Assistant:

void Flush(size_t size) {
    size_t size_written = 0;
    for (Datablock& block : blocks_) {
      size_t block_size = std::min<size_t>(block.size, size - size_written);
      dest_->AppendAndTakeOwnership(block.data, block_size,
                                    &SnappySinkAllocator::Deleter, NULL);
      size_written += block_size;
    }
    blocks_.clear();
  }